

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_add_clip(nk_draw_list *list,nk_rect rect)

{
  nk_draw_command *pnVar1;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x24ab,"void nk_draw_list_add_clip(struct nk_draw_list *, struct nk_rect)");
  }
  if (list->cmd_count == 0) {
    pnVar1 = (nk_draw_command *)&list->config;
  }
  else {
    pnVar1 = nk_draw_list_command_last(list);
    if (pnVar1->elem_count == 0) {
      (pnVar1->clip_rect).x = rect.x;
      (pnVar1->clip_rect).y = rect.y;
      (pnVar1->clip_rect).w = rect.w;
      (pnVar1->clip_rect).h = rect.h;
    }
  }
  nk_draw_list_push_command(list,rect,pnVar1->texture);
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_add_clip(struct nk_draw_list *list, struct nk_rect rect)
{
    NK_ASSERT(list);
    if (!list) return;
    if (!list->cmd_count) {
        nk_draw_list_push_command(list, rect, list->config.null.texture);
    } else {
        struct nk_draw_command *prev = nk_draw_list_command_last(list);
        if (prev->elem_count == 0)
            prev->clip_rect = rect;
        nk_draw_list_push_command(list, rect, prev->texture);
    }
}